

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

void qtree_onebit64(LONGLONG *a,int n,int nx,int ny,uchar *b,int bit)

{
  ulong uVar1;
  byte bVar2;
  int local_60;
  int local_5c;
  int s00;
  int s10;
  LONGLONG b3;
  LONGLONG b2;
  LONGLONG b1;
  LONGLONG b0;
  int k;
  int j;
  int i;
  int bit_local;
  uchar *b_local;
  int ny_local;
  int nx_local;
  int n_local;
  LONGLONG *a_local;
  
  bVar2 = (byte)bit;
  uVar1 = 1L << (bVar2 & 0x3f);
  b0._0_4_ = 0;
  for (k = 0; k < nx + -1; k = k + 2) {
    local_60 = n * k;
    local_5c = local_60 + n;
    for (b0._4_4_ = 0; b0._4_4_ < ny + -1; b0._4_4_ = b0._4_4_ + 2) {
      b[(int)b0] = (uchar)((long)(a[local_5c + 1] & uVar1 | (a[local_5c] & uVar1) << 1 |
                                  (a[local_60 + 1] & uVar1) << 2 | (a[local_60] & uVar1) << 3) >>
                          (bVar2 & 0x3f));
      b0._0_4_ = (int)b0 + 1;
      local_60 = local_60 + 2;
      local_5c = local_5c + 2;
    }
    if (b0._4_4_ < ny) {
      b[(int)b0] = (uchar)((long)((a[local_5c] & uVar1) << 1 | (a[local_60] & uVar1) << 3) >>
                          (bVar2 & 0x3f));
      b0._0_4_ = (int)b0 + 1;
    }
  }
  if (k < nx) {
    local_60 = n * k;
    for (b0._4_4_ = 0; b0._4_4_ < ny + -1; b0._4_4_ = b0._4_4_ + 2) {
      b[(int)b0] = (uchar)((long)((a[local_60 + 1] & uVar1) << 2 | (a[local_60] & uVar1) << 3) >>
                          (bVar2 & 0x3f));
      b0._0_4_ = (int)b0 + 1;
      local_60 = local_60 + 2;
    }
    if (b0._4_4_ < ny) {
      b[(int)b0] = (uchar)((long)((a[local_60] & uVar1) << 3) >> (bVar2 & 0x3f));
    }
  }
  return;
}

Assistant:

static void
qtree_onebit64(LONGLONG a[], int n, int nx, int ny, unsigned char b[], int bit)
{
int i, j, k;
LONGLONG b0, b1, b2, b3;
int s10, s00;

	/*
	 * use selected bit to get amount to shift
	 */
	b0 = ((LONGLONG) 1)<<bit;
	b1 = b0<<1;
	b2 = b0<<2;
	b3 = b0<<3;
	k = 0;							/* k is index of b[i/2,j/2]	*/
	for (i = 0; i<nx-1; i += 2) {
		s00 = n*i;					/* s00 is index of a[i,j]	*/
		s10 = s00+n;				/* s10 is index of a[i+1,j]	*/
		for (j = 0; j<ny-1; j += 2) {
			b[k] = (unsigned char) (( ( a[s10+1]     & b0)
				   | ((a[s10  ]<<1) & b1)
				   | ((a[s00+1]<<2) & b2)
				   | ((a[s00  ]<<3) & b3) ) >> bit);
			k += 1;
			s00 += 2;
			s10 += 2;
		}
		if (j < ny) {
			/*
			 * row size is odd, do last element in row
			 * s00+1,s10+1 are off edge
			 */
			b[k] = (unsigned char) (( ((a[s10  ]<<1) & b1)
				   | ((a[s00  ]<<3) & b3) ) >> bit);
			k += 1;
		}
	}
	if (i < nx) {
		/*
		 * column size is odd, do last row
		 * s10,s10+1 are off edge
		 */
		s00 = n*i;
		for (j = 0; j<ny-1; j += 2) {
			b[k] = (unsigned char) (( ((a[s00+1]<<2) & b2)
				   | ((a[s00  ]<<3) & b3) ) >> bit);
			k += 1;
			s00 += 2;
		}
		if (j < ny) {
			/*
			 * both row and column size are odd, do corner element
			 * s00+1, s10, s10+1 are off edge
			 */
			b[k] = (unsigned char) (( ((a[s00  ]<<3) & b3) ) >> bit);
			k += 1;
		}
	}
}